

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

LogLevel cmake::StringToLogLevel(string *levelStr)

{
  size_t __n;
  pointer ppVar1;
  _Alloc_hider __s2;
  size_type __n_00;
  int iVar2;
  long lVar3;
  LogLevel LVar4;
  long lVar5;
  pointer ppVar6;
  pointer ppVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
  __l;
  string levelStrLowCase;
  allocator_type local_165;
  LogLevel local_164 [7];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_148;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_120;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_58;
  
  if ((StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_)
     , iVar2 != 0)) {
    local_164[6] = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>
              (&local_148,(char (*) [6])0x54d791,local_164 + 6);
    local_164[5] = 2;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[8],_cmake::LogLevel,_true>
              (&local_120,(char (*) [8])0x51c7a5,local_164 + 5);
    local_164[4] = 3;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[7],_cmake::LogLevel,_true>(&local_f8,(char (*) [7])"notice",local_164 + 4)
    ;
    local_164[3] = 4;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[7],_cmake::LogLevel,_true>(&local_d0,(char (*) [7])0x54b0ea,local_164 + 3)
    ;
    local_164[2] = 5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[8],_cmake::LogLevel,_true>(&local_a8,(char (*) [8])0x50dc0d,local_164 + 2)
    ;
    local_164[1] = 6;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>(&local_80,(char (*) [6])0x50f4f1,local_164 + 1)
    ;
    local_164[0] = LOG_TRACE;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>(&local_58,(char (*) [6])0x50da45,local_164);
    __l._M_len = 7;
    __l._M_array = &local_148;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
    ::vector(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_,__l,&local_165);
    lVar3 = -0x118;
    paVar8 = &local_58.first.field_2;
    do {
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar8->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                        paVar8->_M_allocated_capacity + 1);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar8->_M_allocated_capacity + -5);
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0);
    __cxa_atexit(std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                 ::~vector,&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_);
  }
  cmsys::SystemTools::LowerCase(&local_148.first,levelStr);
  __n_00 = local_148.first._M_string_length;
  __s2._M_p = local_148.first._M_dataplus._M_p;
  ppVar1 = StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (lVar3 >> 3) * -0x3333333333333333 >> 2;
  ppVar7 = StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar5) {
    ppVar6 = StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5 * 4;
    lVar5 = lVar5 + 1;
    ppVar7 = StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    do {
      if ((__n_00 == ppVar7[-2].first._M_string_length) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp(ppVar7[-2].first._M_dataplus._M_p,__s2._M_p,__n_00), iVar2 == 0)))) {
        ppVar7 = ppVar7 + -2;
        goto LAB_001dc945;
      }
      if ((__n_00 == ppVar7[-1].first._M_string_length) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp(ppVar7[-1].first._M_dataplus._M_p,__s2._M_p,__n_00), iVar2 == 0)))) {
        ppVar7 = ppVar7 + -1;
        goto LAB_001dc945;
      }
      if ((__n_00 == (ppVar7->first)._M_string_length) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp((ppVar7->first)._M_dataplus._M_p,__s2._M_p,__n_00), iVar2 == 0))))
      goto LAB_001dc945;
      if ((__n_00 == ppVar7[1].first._M_string_length) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp(ppVar7[1].first._M_dataplus._M_p,__s2._M_p,__n_00), iVar2 == 0)))) {
        ppVar7 = ppVar7 + 1;
        goto LAB_001dc945;
      }
      lVar5 = lVar5 + -1;
      ppVar7 = ppVar7 + 4;
    } while (1 < lVar5);
    lVar3 = (long)ppVar1 - (long)ppVar6;
    ppVar7 = ppVar6;
  }
  lVar3 = (lVar3 >> 3) * -0x3333333333333333;
  LVar4 = LOG_UNDEFINED;
  if (lVar3 == 3) {
    __n = (ppVar7->first)._M_string_length;
    if ((local_148.first._M_string_length != __n) ||
       ((__n != 0 &&
        (iVar2 = bcmp((ppVar7->first)._M_dataplus._M_p,local_148.first._M_dataplus._M_p,__n),
        iVar2 != 0)))) {
      ppVar7 = ppVar7 + 1;
      goto LAB_001dc8f6;
    }
  }
  else {
    if (lVar3 == 2) {
LAB_001dc8f6:
      if ((local_148.first._M_string_length == (ppVar7->first)._M_string_length) &&
         ((local_148.first._M_string_length == 0 ||
          (iVar2 = bcmp((ppVar7->first)._M_dataplus._M_p,local_148.first._M_dataplus._M_p,
                        local_148.first._M_string_length), iVar2 == 0)))) goto LAB_001dc945;
      ppVar7 = ppVar7 + 1;
    }
    else if (lVar3 != 1) goto LAB_001dc953;
    if ((local_148.first._M_string_length != (ppVar7->first)._M_string_length) ||
       ((local_148.first._M_string_length != 0 &&
        (iVar2 = bcmp((ppVar7->first)._M_dataplus._M_p,local_148.first._M_dataplus._M_p,
                      local_148.first._M_string_length), LVar4 = LOG_UNDEFINED, iVar2 != 0))))
    goto LAB_001dc953;
  }
LAB_001dc945:
  if (ppVar7 == ppVar1) {
    LVar4 = LOG_UNDEFINED;
  }
  else {
    LVar4 = ppVar7->second;
  }
LAB_001dc953:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
    operator_delete(local_148.first._M_dataplus._M_p,
                    local_148.first.field_2._M_allocated_capacity + 1);
  }
  return LVar4;
}

Assistant:

cmake::LogLevel cmake::StringToLogLevel(const std::string& levelStr)
{
  using LevelsPair = std::pair<std::string, LogLevel>;
  static const std::vector<LevelsPair> levels = {
    { "error", LogLevel::LOG_ERROR },     { "warning", LogLevel::LOG_WARNING },
    { "notice", LogLevel::LOG_NOTICE },   { "status", LogLevel::LOG_STATUS },
    { "verbose", LogLevel::LOG_VERBOSE }, { "debug", LogLevel::LOG_DEBUG },
    { "trace", LogLevel::LOG_TRACE }
  };

  const auto levelStrLowCase = cmSystemTools::LowerCase(levelStr);

  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&levelStrLowCase](const LevelsPair& p) {
                                 return p.first == levelStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : LogLevel::LOG_UNDEFINED;
}